

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

void Sim_UtilTransferNodeOne
               (Abc_Obj_t *pNode,Vec_Ptr_t *vSimInfo,int nSimWords,int nOffset,int fShift)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  if (0xfffffffd < (*(uint *)&pNode->field_0x14 & 0xf) - 5) {
    pvVar1 = Vec_PtrEntry(vSimInfo,pNode->Id);
    pvVar2 = Vec_PtrEntry(vSimInfo,*(pNode->vFanins).pArray);
    uVar3 = 0;
    iVar4 = 0;
    if (0 < fShift) {
      iVar4 = nSimWords;
    }
    if (0 < nSimWords) {
      uVar3 = (ulong)(uint)nSimWords;
    }
    if ((pNode->field_0x15 & 4) == 0) {
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)pvVar1 + uVar5 * 4 + (long)(iVar4 + nOffset) * 4) =
             *(undefined4 *)((long)pvVar2 + uVar5 * 4 + (long)nOffset * 4);
      }
    }
    else {
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        *(uint *)((long)pvVar1 + uVar5 * 4 + (long)(iVar4 + nOffset) * 4) =
             ~*(uint *)((long)pvVar2 + uVar5 * 4 + (long)nOffset * 4);
      }
    }
    return;
  }
  __assert_fail("Abc_ObjIsCo(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simUtils.c"
                ,0x15a,"void Sim_UtilTransferNodeOne(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
}

Assistant:

void Sim_UtilTransferNodeOne( Abc_Obj_t * pNode, Vec_Ptr_t * vSimInfo, int nSimWords, int nOffset, int fShift )
{
    unsigned * pSimmNode, * pSimmNode1;
    int k, fComp1;
    // simulate the internal nodes
    assert( Abc_ObjIsCo(pNode) );
    pSimmNode  = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
    pSimmNode1 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId0(pNode));
    pSimmNode  += nOffset + (fShift > 0)*nSimWords;
    pSimmNode1 += nOffset;
    fComp1 = Abc_ObjFaninC0(pNode);
    if ( fComp1 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] = ~pSimmNode1[k];
    else 
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] =  pSimmNode1[k];
}